

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_recv_atleast(Curl_easy *data,size_t nbytes)

{
  bool bVar1;
  CURLcode CVar2;
  size_t sVar3;
  ulong uVar4;
  dynbuf *s;
  ssize_t nread;
  uchar readbuf [1024];
  size_t local_430;
  char local_428 [1032];
  
  s = &((data->req).p.mqtt)->recvbuf;
  sVar3 = Curl_dyn_len(s);
  if (nbytes < sVar3 || nbytes - sVar3 == 0) goto LAB_00144621;
  CVar2 = Curl_xfer_recv(data,local_428,nbytes - sVar3,(ssize_t *)&local_430);
  uVar4 = (ulong)CVar2;
  if (CVar2 == CURLE_OK) {
    CVar2 = Curl_dyn_addn(s,local_428,local_430);
    if (CVar2 != CURLE_OK) {
      uVar4 = 0x1b;
      goto LAB_0014461b;
    }
    uVar4 = Curl_dyn_len(s);
    bVar1 = true;
    sVar3 = uVar4;
  }
  else {
LAB_0014461b:
    bVar1 = false;
  }
  if (!bVar1) {
    return (CURLcode)uVar4;
  }
LAB_00144621:
  CVar2 = CURLE_AGAIN;
  if (nbytes <= sVar3) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode mqtt_recv_atleast(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = data->req.p.mqtt;
  size_t rlen = Curl_dyn_len(&mq->recvbuf);
  CURLcode result;

  if(rlen < nbytes) {
    unsigned char readbuf[1024];
    ssize_t nread;

    DEBUGASSERT(nbytes - rlen < sizeof(readbuf));
    result = Curl_xfer_recv(data, (char *)readbuf, nbytes - rlen, &nread);
    if(result)
      return result;
    DEBUGASSERT(nread >= 0);
    if(Curl_dyn_addn(&mq->recvbuf, readbuf, (size_t)nread))
      return CURLE_OUT_OF_MEMORY;
    rlen = Curl_dyn_len(&mq->recvbuf);
  }
  return (rlen >= nbytes) ? CURLE_OK : CURLE_AGAIN;
}